

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O0

PaError Pa_SetStreamFinishedCallback
                  (PaStream *stream,PaStreamFinishedCallback *streamFinishedCallback)

{
  undefined4 local_1c;
  PaError result;
  PaStreamFinishedCallback *streamFinishedCallback_local;
  PaStream *stream_local;
  
  local_1c = PaUtil_ValidateStreamPointer(stream);
  if (local_1c == 0) {
    local_1c = (**(code **)(*(long *)((long)stream + 0x10) + 0x20))(stream);
    if (local_1c == 0) {
      local_1c = -0x26fe;
    }
    if (local_1c == 1) {
      *(PaStreamFinishedCallback **)((long)stream + 0x20) = streamFinishedCallback;
      local_1c = 0;
    }
  }
  return local_1c;
}

Assistant:

PaError Pa_SetStreamFinishedCallback( PaStream *stream, PaStreamFinishedCallback* streamFinishedCallback )
{
    PaError result = PaUtil_ValidateStreamPointer( stream );

    PA_LOGAPI_ENTER_PARAMS( "Pa_SetStreamFinishedCallback" );
    PA_LOGAPI(("\tPaStream* stream: 0x%p\n", stream ));
    PA_LOGAPI(("\tPaStreamFinishedCallback* streamFinishedCallback: 0x%p\n", streamFinishedCallback ));

    if( result == paNoError )
    {
        result = PA_STREAM_INTERFACE(stream)->IsStopped( stream );
        if( result == 0 )
        {
            result = paStreamIsNotStopped ;
        }
        if( result == 1 )
        {
            PA_STREAM_REP( stream )->streamFinishedCallback = streamFinishedCallback;
            result = paNoError;
        }
    }

    PA_LOGAPI_EXIT_PAERROR( "Pa_SetStreamFinishedCallback", result );

    return result;

}